

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O2

void nh_describe_pos(int x,int y,nh_desc_buf *bufs)

{
  monst *pmVar1;
  bool bVar2;
  bool bVar3;
  aligntyp alignment;
  boolean bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  trap *ptVar9;
  char *pcVar10;
  size_t sVar11;
  obj *poVar12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  obj *obj;
  char *pcVar16;
  vptrs *pvVar17;
  char *pcVar18;
  level *lev;
  char *pcVar19;
  char *pcVar20;
  byte bVar21;
  uint uVar22;
  bool bVar23;
  bool bVar24;
  char visionbuf [256];
  char race [128];
  char steedbuf [256];
  
  uVar5 = dbuf_get_mon(x,y);
  bufs->bgdesc[0] = '\0';
  bufs->trapdesc[0] = '\0';
  bufs->objdesc[0] = '\0';
  bufs->mondesc[0] = '\0';
  bufs->invisdesc[0] = '\0';
  bufs->effectdesc[0] = '\0';
  bufs->objcount = -1;
  if (program_state.game_running == 0) {
    return;
  }
  iVar13 = exit_jmp_buf_valid + 1;
  bVar23 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar13;
  if ((bVar23) && (iVar13 = __sigsetjmp(exit_jmp_buf,1), iVar13 != 0)) {
    return;
  }
  uVar14 = *(uint *)(level->locations[x] + y) & 0x3f;
  if (uVar14 != 0) {
    if (uVar14 == 0x13) {
      bVar4 = on_level(&u.uz,&dungeon_topology.d_air_level);
      pcVar16 = "cloudy area";
      if (bVar4 == '\0') {
        pcVar16 = "fog/vapor cloud";
      }
LAB_001ff6e5:
      strcpy(bufs->bgdesc,pcVar16);
    }
    else if (uVar14 == 0x18) {
      iVar13 = is_drawbridge_wall(x,y);
      if (iVar13 < 0) {
        if ((*(uint *)&level->locations[x][y].field_0x6 & 0xf0) != 0x10) {
          uVar8 = 0x796177726f6f64;
          goto LAB_001ff741;
        }
        builtin_strncpy(bufs->bgdesc,"broken door",0xc);
      }
      else {
        builtin_strncpy(bufs->bgdesc,"open drawbridge portcullis",0x1b);
      }
    }
    else {
      if (uVar14 != 0x26) {
        pcVar16 = defexplain[uVar14];
        goto LAB_001ff6e5;
      }
      if (u.uz.dnum == dungeon_topology.d_astral_level.dnum) {
        builtin_strncpy(bufs->bgdesc + 6,"d altar",8);
        uVar8 = 0x2064656e67696c61;
LAB_001ff741:
        *(undefined8 *)bufs->bgdesc = uVar8;
      }
      else {
        uVar14 = *(uint *)&level->locations[x][y].field_0x6 >> 4 & 0x17;
        if (uVar14 == 0) {
          alignment = -0x80;
        }
        else if (uVar14 == 4) {
          alignment = '\x01';
        }
        else {
          alignment = (char)uVar14 + -2;
        }
        pcVar16 = align_str(alignment);
        sprintf(bufs->bgdesc,"%s altar",pcVar16,0);
      }
    }
  }
  if (((undefined1  [12])((undefined1  [12])level->locations[x][y] & (undefined1  [12])0x7c0) !=
       (undefined1  [12])0x0) &&
     ((((0x193 < (int)uVar5 || uVar5 == 0 ||
        ((((u.ux == x && (u.uy == y)) || (pmVar1 = level->monsters[x][y], pmVar1 == (monst *)0x0))
         || (((*(uint *)&pmVar1->field_0x60 & 0x800200) != 0x800000 || ((viz_array[y][x] & 2U) == 0)
             ))))) || (ptVar9 = t_at(level,x,y), ptVar9 == (trap *)0x0)) ||
      ((uVar14 = (byte)ptVar9->field_0x8 & 0x1f, 0x13 < uVar14 || ((0x81820U >> uVar14 & 1) == 0))))
     )) {
    strcpy(bufs->trapdesc,
           *(char **)((long)defexplain +
                     (ulong)(*(uint *)(level->locations[x] + y) >> 3 & 0xf8) + 0x178));
  }
  lev = level;
  uVar22 = *(uint *)(level->locations[x] + y) >> 0xb & 0x3ff;
  uVar14 = 0xffffffff;
  iVar13 = uVar22 - 1;
  if (uVar22 != 0) {
    poVar12 = uball;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ff8a9;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ff8a4;
LAB_001ff8f0:
      bVar23 = true;
      bVar24 = false;
    }
    else {
LAB_001ff8a4:
      if (ublindf == (obj *)0x0) {
        if (uball == (obj *)0x0) {
          bVar23 = true;
          bVar24 = false;
          poVar12 = (obj *)0x0;
          goto LAB_001ff961;
        }
      }
      else {
LAB_001ff8a9:
        if (ublindf->oartifact == '\x1d' || uball == (obj *)0x0) goto LAB_001ff8f0;
      }
      bVar23 = true;
      if ((((u.bc_felt & 1U) == 0) && (uball->where != '\x03')) && (uball->ox == x)) {
        bVar23 = uball->oy != y;
      }
      if (((u.bc_felt & 2U) == 0) && (uchain->ox == x)) {
        bVar24 = uchain->oy == y;
      }
      else {
        bVar24 = false;
      }
    }
LAB_001ff961:
    pcVar16 = bufs->objdesc;
    pvVar17 = (vptrs *)(level->objects[x] + y);
    while (obj = pvVar17->v_nexthere, obj != (obj *)0x0) {
      if ((((bVar23 ^ 1U) & obj == poVar12) == 0) && ((obj == uchain & bVar24) == 0)) {
        if (iVar13 == obj->otyp) {
          pcVar10 = distant_name(obj,xname);
          strcpy(pcVar16,pcVar10);
          lev = level;
          goto LAB_001ffaa0;
        }
        break;
      }
      pvVar17 = &obj->v;
    }
    if (iVar13 == 0) {
      builtin_strncpy(pcVar16,"strange object",0xf);
    }
    else {
      poVar12 = mksobj(level,iVar13,'\0','\0');
      if (poVar12->oclass == '\f') {
        poVar12->quan = 1;
      }
      else if (poVar12->otyp == 0x11e) {
        poVar12->spe = (schar)current_fruit;
      }
      if (*(int *)(level->locations[x] + y) < 0) {
        poVar12->field_0x4b = poVar12->field_0x4b | 0x20;
      }
      pcVar10 = distant_name(poVar12,xname);
      strcpy(pcVar16,pcVar10);
      dealloc_obj(poVar12);
      obj = level->objects[x][y];
      lev = level;
    }
LAB_001ffaa0:
    if ((lev->locations[x][y].field_0x3 & 0x40) != 0) {
      sVar11 = strlen(pcVar16);
      builtin_strncpy(pcVar16 + sVar11," and more",10);
      lev = level;
    }
    bVar21 = lev->locations[x][y].typ;
    if ((bVar21 & 0xef) == 0) {
      sVar11 = strlen(pcVar16);
      builtin_strncpy(pcVar16 + sVar11," embedded in stone",0x13);
    }
    else if ((char)bVar21 < '\r' || bVar21 == 0xf) {
      sVar11 = strlen(pcVar16);
      builtin_strncpy(pcVar16 + sVar11," embedded in a wall",0x14);
    }
    else {
      bVar4 = closed_door(lev,x,y);
      if (bVar4 == '\0') {
        bVar4 = is_pool(level,x,y);
        if (bVar4 == '\0') {
          bVar4 = is_lava(level,x,y);
          if (bVar4 != '\0') {
            sVar11 = strlen(pcVar16);
            builtin_strncpy(pcVar16 + sVar11," in molten lava",0x10);
          }
        }
        else {
          sVar11 = strlen(pcVar16);
          builtin_strncpy(pcVar16 + sVar11," in water",10);
        }
      }
      else {
        sVar11 = strlen(pcVar16);
        builtin_strncpy(pcVar16 + sVar11," embedded in a door",0x14);
      }
    }
    uVar14 = 0xffffffff;
    if (((viz_array[y][x] & 2U) != 0) && (uVar14 = 1, obj != (obj *)0x0)) {
      uVar14 = (uint)(iVar13 != obj->otyp);
      for (; obj != (obj *)0x0; obj = (obj->v).v_nexthere) {
        uVar14 = uVar14 + (byte)((obj != uchain | bVar24 ^ 1U) & (obj != uball | bVar23));
      }
    }
  }
  bufs->objcount = uVar14;
  bVar23 = true;
  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
    if (u.umonnum == u.umonster) {
      bVar23 = false;
    }
    else {
      bVar4 = dmgtype(youmonst.data,0x24);
      bVar23 = bVar4 != '\0';
    }
  }
  if (uVar5 != 0) {
    pcVar16 = bufs->mondesc;
    if ((u.ux == x) && (u.uy == y)) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001ffc3b;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001ffc32;
LAB_001ffc99:
        if ((u._1052_1_ & 1) == 0) {
          if (((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
                 (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
               (u.uprops[0xd].blocked == 0)) && (u.uprops[0xc].intrinsic == 0)) &&
             (u.uprops[0xc].extrinsic == 0)) {
            if (((u._1052_1_ & 4) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
LAB_001ffd69:
              if ((u.uprops[0x19].extrinsic == 0 || u.uprops[0x19].blocked != 0) &&
                 ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0))))
              goto LAB_001ffd93;
            }
          }
          else if ((u._1052_1_ & 4) != 0) goto LAB_001ffd69;
        }
      }
      else {
LAB_001ffc32:
        if (ublindf != (obj *)0x0) {
LAB_001ffc3b:
          if (ublindf->oartifact == '\x1d') goto LAB_001ffc99;
        }
      }
      race[0] = '\0';
      if (u.umonnum == u.umonster) {
        sprintf(race,"%s ",urace.adj);
      }
      pcVar10 = "invisible ";
      if (u.uprops[0xd].blocked != 0) {
        pcVar10 = "";
      }
      pcVar15 = "";
      if (youmonst.data == mons + 0x7b) {
        pcVar15 = pcVar10;
      }
      if (youmonst.data == mons + 0x9e) {
        pcVar15 = pcVar10;
      }
      if (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0) {
        pcVar15 = pcVar10;
      }
      pcVar10 = mons_mname(mons + u.umonnum);
      sprintf(pcVar16,"%s%s%s called %s",pcVar15,race,pcVar10,plname);
      if (u.usteed != (monst *)0x0) {
        pcVar10 = y_monnam(u.usteed);
        sprintf(steedbuf,", mounted on %s",pcVar10);
        strcat(pcVar16,steedbuf);
      }
      if ((((((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
              (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
            (u.uprops[0xd].blocked == 0)) && (u.uprops[0xc].intrinsic == 0)) &&
          ((u.uprops[0xc].extrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000000) == 0)))) ||
         ((u._1052_1_ & 4) != 0)) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001fff5b;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001fff52;
LAB_00200004:
          if ((u._1052_1_ & 1) == 0) {
            if ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (uVar5 = 0, ((youmonst.data)->mflags3 & 0x100) != 0)) {
              uVar5 = 1;
            }
            uVar14 = uVar5 + 2;
            if (u.uprops[0x19].blocked != 0) {
              uVar14 = uVar5;
            }
            if (u.uprops[0x19].extrinsic == 0) {
              uVar14 = uVar5;
            }
            uVar5 = uVar14 + 4;
            if (u.uprops[0x42].extrinsic == 0 && u.uprops[0x42].intrinsic == 0) {
              uVar5 = uVar14;
            }
            if (uVar5 != 0) {
              pcVar16 = eos(pcVar16);
              pcVar10 = "infravision";
              if ((uVar5 & 1) == 0) {
                pcVar10 = "";
              }
              pcVar20 = ", ";
              pcVar15 = "";
              if ((~uVar5 & 3) == 0) {
                pcVar15 = ", ";
              }
              pcVar19 = "telepathy";
              if ((uVar5 & 2) == 0) {
                pcVar19 = "";
              }
              if (uVar5 < 5) {
                pcVar20 = "";
              }
              pcVar18 = "monster detection";
              if (uVar5 < 4) {
                pcVar18 = "";
              }
              sprintf(pcVar16," [seen: %s%s%s%s%s]",pcVar10,pcVar15,pcVar19,pcVar20,pcVar18);
            }
          }
        }
        else {
LAB_001fff52:
          if (ublindf != (obj *)0x0) {
LAB_001fff5b:
            if (ublindf->oartifact == '\x1d') goto LAB_00200004;
          }
        }
      }
    }
    else {
LAB_001ffd93:
      if ((int)uVar5 < 0x194) {
        pmVar1 = level->monsters[x][y];
        if ((pmVar1 != (monst *)0x0) && ((pmVar1->field_0x61 & 2) == 0)) {
          bhitpos.x = (xchar)x;
          bhitpos.y = (xchar)y;
          if ((bool)(pmVar1->data == mons + 0x10 & bVar23)) {
            pcVar10 = coyotename(pmVar1,race);
          }
          else {
            pcVar10 = distant_monnam(pmVar1,0,race);
          }
          if ((pmVar1->mx != x) || (pcVar15 = "", pmVar1->my != y)) {
            pcVar15 = "tail of ";
            if (!bVar23) {
              pcVar15 = "tail of a ";
            }
            if ((pmVar1->field_0x63 & 2) == 0) {
              pcVar15 = "tail of a ";
            }
          }
          if ((bool)(pmVar1->mtame != '\0' & bVar23)) {
            pcVar20 = "tame ";
          }
          else {
            pcVar20 = "peaceful ";
            if (!bVar23) {
              pcVar20 = "";
            }
            if ((pmVar1->field_0x62 & 0x40) == 0) {
              pcVar20 = "";
            }
          }
          sprintf(pcVar16,"%s%s%s",pcVar15,pcVar20,pcVar10);
          if (u.ustuck == pmVar1) {
            if (u.umonnum == u.umonster) {
              pcVar10 = ", holding you";
            }
            else {
              bVar4 = sticks(youmonst.data);
              pcVar10 = ", being held";
              if (bVar4 == '\0') {
                pcVar10 = ", holding you";
              }
            }
            strcat(pcVar16,pcVar10);
          }
          uVar5 = *(uint *)&pmVar1->field_0x60;
          if ((uVar5 >> 0x18 & 1) != 0) {
            sVar11 = strlen(pcVar16);
            builtin_strncpy(pcVar16 + sVar11,", leashed to you",0x11);
            uVar5 = *(uint *)&pmVar1->field_0x60;
          }
          if ((uVar5 >> 0x17 & 1) != 0) {
            if (((((viz_array[pmVar1->my][pmVar1->mx] & 2U) != 0) &&
                 (ptVar9 = t_at(level,(int)pmVar1->mx,(int)pmVar1->my), ptVar9 != (trap *)0x0)) &&
                (uVar5 = (byte)ptVar9->field_0x8 & 0x1f, (byte)uVar5 < 0x14)) &&
               ((0x81820U >> uVar5 & 1) != 0)) {
              pcVar10 = eos(pcVar16);
              pcVar15 = an(trapexplain[uVar5 - 1]);
              sprintf(pcVar10,", trapped in %s",pcVar15);
            }
          }
          if (pmVar1->wormno == '\0') {
            if ((viz_array[pmVar1->my][pmVar1->mx] & 2U) != 0) goto LAB_002003b0;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00200351;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00200348;
            }
            else {
LAB_00200348:
              if (ublindf == (obj *)0x0) goto LAB_00200401;
LAB_00200351:
              if (ublindf->oartifact != '\x1d') goto LAB_00200401;
            }
            if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
               (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_00200401;
            bVar23 = false;
            if (((viz_array[pmVar1->my][pmVar1->mx] & 1U) != 0) &&
               ((pmVar1->data->mflags3 & 0x200) != 0)) goto LAB_002003b0;
          }
          else {
            bVar4 = worm_known(level,pmVar1);
            if (bVar4 == '\0') {
LAB_00200401:
              bVar23 = false;
            }
            else {
LAB_002003b0:
              uVar5 = *(uint *)&pmVar1->field_0x60;
              if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((char)uVar5 < '\0') goto LAB_00200401;
              }
              else {
                bVar23 = false;
                if (((char)uVar5 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
                goto LAB_00200405;
              }
              bVar23 = (u._1052_1_ & 0x20) == 0 && (uVar5 >> 9 & 1) == 0;
            }
          }
LAB_00200405:
          visionbuf[0] = '\0';
          iVar13 = -1;
          if (-1 < u.xray_range) {
            iVar13 = u.xray_range * u.xray_range;
          }
          if (pmVar1->wormno == '\0') {
            uVar5 = 0;
            bVar24 = false;
            if ((viz_array[pmVar1->my][pmVar1->mx] & 2U) != 0) goto LAB_0020046d;
          }
          else {
            bVar4 = worm_known(level,pmVar1);
            if (bVar4 == '\0') {
              uVar5 = 0;
              bVar24 = false;
            }
            else {
LAB_0020046d:
              uVar14 = *(uint *)&pmVar1->field_0x60;
              if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                uVar5 = 0;
                bVar24 = false;
                if ((uVar14 & 0x280) == 0) goto LAB_002004b4;
              }
              else {
                uVar5 = 0;
                bVar24 = false;
                if (((uVar14 & 0x280) == 0) &&
                   (bVar24 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_002004b4:
                  bVar24 = (u._1052_1_ & 0x20) == 0 && (uVar14 & 2) == 0;
                  uVar5 = (uint)bVar24;
                }
              }
            }
          }
          iVar6 = ((uint)bVar23 & *(uint *)&pmVar1->field_0x60 >> 1) + uVar5;
          if (((((*(uint *)&pmVar1->field_0x60 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
              (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00200527;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020051e;
LAB_0020055f:
              if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                  (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                 ((pmVar1->data->mflags3 & 0x200) != 0)) {
                iVar6 = iVar6 + ((byte)viz_array[pmVar1->my][pmVar1->mx] & 1);
              }
            }
            else {
LAB_0020051e:
              if (ublindf != (obj *)0x0) {
LAB_00200527:
                if (ublindf->oartifact == '\x1d') goto LAB_0020055f;
              }
            }
          }
          if (((pmVar1->data->mflags1 & 0x10000) == 0) &&
             ((poVar12 = which_armor(pmVar1,4), poVar12 == (obj *)0x0 ||
              (poVar12 = which_armor(pmVar1,4), poVar12->otyp != 0x4f)))) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00200600;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002005fb;
LAB_0020068c:
              if ((u.uprops[0x19].extrinsic == 0) ||
                 ((u.uprops[0x19].blocked != 0 ||
                  (iVar7 = dist2((int)pmVar1->mx,(int)pmVar1->my,(int)u.ux,(int)u.uy), 0x40 < iVar7)
                  ))) goto LAB_002006bf;
            }
            else {
LAB_002005fb:
              if (ublindf != (obj *)0x0) {
LAB_00200600:
                if (ublindf->oartifact == '\x1d') goto LAB_0020068c;
              }
              if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                   (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                   youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0))
              goto LAB_0020068c;
            }
            iVar6 = iVar6 + 1;
          }
LAB_002006bf:
          bVar21 = 0 < iVar13 & bVar23;
          if (bVar21 == 1) {
            iVar7 = dist2((int)pmVar1->mx,(int)pmVar1->my,(int)u.ux,(int)u.uy);
            iVar6 = iVar6 + (uint)(iVar7 <= iVar13);
          }
          bVar2 = u.uprops[0x42].extrinsic != 0;
          bVar3 = u.uprops[0x42].intrinsic != 0;
          bVar4 = match_warn_of_mon(pmVar1);
          uVar5 = ((uint)(bVar2 || bVar3) + iVar6 + 1) - (uint)(bVar4 == '\0');
          if (!(bool)(bVar24 & uVar5 < 2)) {
            uVar14 = uVar5;
            if (bVar24) {
              sVar11 = strlen(visionbuf);
              builtin_strncpy(visionbuf + sVar11,"normal vision",0xe);
              uVar14 = uVar5 - 1;
              if (1 < uVar5) {
                sVar11 = strlen(visionbuf);
                (visionbuf + sVar11)[0] = ',';
                (visionbuf + sVar11)[1] = ' ';
                visionbuf[sVar11 + 2] = '\0';
              }
            }
            uVar5 = uVar14;
            if ((bVar23 != false) && ((pmVar1->field_0x60 & 2) != 0)) {
              sVar11 = strlen(visionbuf);
              builtin_strncpy(visionbuf + sVar11,"see invisible",0xe);
              uVar5 = uVar14 - 1;
              if (1 < (int)uVar14) {
                sVar11 = strlen(visionbuf);
                (visionbuf + sVar11)[0] = ',';
                (visionbuf + sVar11)[1] = ' ';
                visionbuf[sVar11 + 2] = '\0';
              }
            }
            if (((((pmVar1->field_0x60 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00200844;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0020083f;
LAB_0020086a:
                if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                    (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                   (((pmVar1->data->mflags3 & 0x200) != 0 &&
                    ((viz_array[pmVar1->my][pmVar1->mx] & 1U) != 0)))) {
                  sVar11 = strlen(visionbuf);
                  builtin_strncpy(visionbuf + sVar11,"infravision",0xc);
                  uVar14 = uVar5 - 1;
                  bVar23 = 1 < (int)uVar5;
                  uVar5 = uVar14;
                  if (bVar23) {
                    sVar11 = strlen(visionbuf);
                    (visionbuf + sVar11)[0] = ',';
                    (visionbuf + sVar11)[1] = ' ';
                    visionbuf[sVar11 + 2] = '\0';
                  }
                }
              }
              else {
LAB_0020083f:
                if (ublindf != (obj *)0x0) {
LAB_00200844:
                  if (ublindf->oartifact == '\x1d') goto LAB_0020086a;
                }
              }
            }
            if (((pmVar1->data->mflags1 & 0x10000) == 0) &&
               ((poVar12 = which_armor(pmVar1,4), poVar12 == (obj *)0x0 ||
                (poVar12 = which_armor(pmVar1,4), poVar12->otyp != 0x4f)))) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00200908;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00200903;
LAB_00200994:
                if ((u.uprops[0x19].extrinsic == 0) ||
                   ((u.uprops[0x19].blocked != 0 ||
                    (iVar6 = dist2((int)pmVar1->mx,(int)pmVar1->my,(int)u.ux,(int)u.uy),
                    0x40 < iVar6)))) goto LAB_00200a0b;
              }
              else {
LAB_00200903:
                if (ublindf != (obj *)0x0) {
LAB_00200908:
                  if (ublindf->oartifact == '\x1d') goto LAB_00200994;
                }
                if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                     (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                     youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0))
                goto LAB_00200994;
              }
              sVar11 = strlen(visionbuf);
              builtin_strncpy(visionbuf + sVar11,"telepathy",10);
              uVar14 = uVar5 - 1;
              bVar23 = 1 < (int)uVar5;
              uVar5 = uVar14;
              if (bVar23) {
                sVar11 = strlen(visionbuf);
                (visionbuf + sVar11)[0] = ',';
                (visionbuf + sVar11)[1] = ' ';
                visionbuf[sVar11 + 2] = '\0';
              }
            }
LAB_00200a0b:
            uVar14 = uVar5;
            if ((bVar21 != 0) &&
               (iVar6 = dist2((int)pmVar1->mx,(int)pmVar1->my,(int)u.ux,(int)u.uy), iVar6 <= iVar13)
               ) {
              sVar11 = strlen(visionbuf);
              builtin_strncpy(visionbuf + sVar11,"astral vision",0xe);
              uVar14 = uVar5 - 1;
              if (1 < (int)uVar5) {
                sVar11 = strlen(visionbuf);
                (visionbuf + sVar11)[0] = ',';
                (visionbuf + sVar11)[1] = ' ';
                visionbuf[sVar11 + 2] = '\0';
              }
            }
            uVar5 = uVar14;
            if (u.uprops[0x42].extrinsic != 0 || u.uprops[0x42].intrinsic != 0) {
              sVar11 = strlen(visionbuf);
              builtin_strncpy(visionbuf + sVar11,"monster detection",0x12);
              uVar5 = uVar14 - 1;
              if (1 < (int)uVar14) {
                sVar11 = strlen(visionbuf);
                (visionbuf + sVar11)[0] = ',';
                (visionbuf + sVar11)[1] = ' ';
                visionbuf[sVar11 + 2] = '\0';
              }
            }
            bVar4 = match_warn_of_mon(pmVar1);
            if (bVar4 != '\0') {
              if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
                 ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))
                 ) {
                pcVar10 = mons_mname(pmVar1->data);
                pcVar10 = makeplural(pcVar10);
                sprintf(steedbuf,"warned of %s",pcVar10);
                strcat(visionbuf,steedbuf);
              }
              else {
                sVar11 = strlen(visionbuf);
                builtin_strncpy(visionbuf + sVar11,"paranoid delusion",0x12);
              }
              if (1 < (int)uVar5) {
                sVar11 = strlen(visionbuf);
                (visionbuf + sVar11)[0] = ',';
                (visionbuf + sVar11)[1] = ' ';
                visionbuf[sVar11 + 2] = '\0';
              }
            }
          }
          if (visionbuf[0] != '\0') {
            sprintf(steedbuf," [seen: %s]",visionbuf);
            sVar11 = strlen(pcVar16);
            strncat(pcVar16,steedbuf,0xff - sVar11);
          }
        }
      }
      else if (uVar5 < 0x19a) {
        strcat(pcVar16,warnexplain[uVar5 - 0x194]);
      }
    }
  }
  if ((level->locations[x][y].field_0x6 & 8) != 0) {
    builtin_strncpy(bufs->invisdesc,"remembered, unseen, creature",0x1d);
  }
  if (((u._1052_1_ & 1) == 0) || ((u.ux == x && (u.uy == y)))) goto LAB_00200c96;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00200c49;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00200c44;
LAB_00200c76:
    pcVar16 = a_monnam(u.ustuck);
  }
  else {
LAB_00200c44:
    if (ublindf != (obj *)0x0) {
LAB_00200c49:
      if (ublindf->oartifact == '\x1d') goto LAB_00200c76;
    }
    pcVar16 = "a monster";
  }
  sprintf(bufs->effectdesc,"interior of %s",pcVar16);
LAB_00200c96:
  exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
  return;
}

Assistant:

void nh_describe_pos(int x, int y, struct nh_desc_buf *bufs)
{
    int monid = dbuf_get_mon(x, y);
    
    bufs->bgdesc[0] = '\0';
    bufs->trapdesc[0] = '\0';
    bufs->objdesc[0] = '\0';
    bufs->mondesc[0] = '\0';
    bufs->invisdesc[0] = '\0';
    bufs->effectdesc[0] = '\0';
    bufs->objcount = -1;
    
    if (!program_state.game_running || !api_entry_checkpoint())
	return;
    
    describe_bg(x, y, level->locations[x][y].mem_bg, bufs->bgdesc);
    
    if (level->locations[x][y].mem_trap) {
	/* Avoid "monster trapped in a web on a web" from describe_mon(). */
	const struct monst *mtmp;
	const struct trap *t;
	if (!(monid &&					/* monster seen */
		(monid - 1) < NUMMONS &&		/* not a monster warning */
		!(u.ux == x && u.uy == y) &&		/* not the hero */
		(mtmp = m_at(level, x, y)) &&		/* monster at location */
		(mtmp->mtrapped && cansee(x, y)) &&	/* mon seen in trap */
		(t = t_at(level, x, y)) &&		/* trap at location */
		(t->ttyp == BEAR_TRAP || t->ttyp == PIT ||
		 t->ttyp == SPIKED_PIT || t->ttyp == WEB)))
	    strcpy(bufs->trapdesc, trapexplain[level->locations[x][y].mem_trap - 1]);
    }
    
    bufs->objcount = describe_object(x, y, level->locations[x][y].mem_obj - 1,
				     bufs->objdesc);
    
    describe_mon(x, y, monid - 1, bufs->mondesc);
    
    if (level->locations[x][y].mem_invis)
	strcpy(bufs->invisdesc, invisexplain);
    
    if (u.uswallow && (x != u.ux || y != u.uy)) {
	/* all locations when swallowed other than the hero are the monster */
	sprintf(bufs->effectdesc, "interior of %s", Blind ? "a monster" : a_monnam(u.ustuck));
    }
    
    api_exit();
}